

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O0

Var Js::RegexHelper::RegexSearchImpl
              (ScriptContext *scriptContext,JavascriptRegExp *regularExpression,
              JavascriptString *input)

{
  bool bVar1;
  bool isSticky;
  RegexPattern *pattern_00;
  Type local_78;
  GroupInfo local_54;
  GroupInfo match;
  CharCount inputLength;
  char16 *inputStr;
  RegexPattern *pattern;
  JavascriptString *input_local;
  JavascriptRegExp *regularExpression_local;
  ScriptContext *scriptContext_local;
  Var local_10;
  
  pattern_00 = JavascriptRegExp::GetPattern(regularExpression);
  register0x00000000 = JavascriptString::GetString(input);
  match.offset = JavascriptString::GetLength(input);
  RegexHelperTrace(scriptContext,Search,regularExpression,input);
  local_54 = SimpleMatch(scriptContext,pattern_00,stack0xffffffffffffffb8,match.offset,0);
  bVar1 = UnifiedRegex::RegexPattern::IsGlobal(pattern_00);
  isSticky = UnifiedRegex::RegexPattern::IsSticky(pattern_00);
  PropagateLastMatch(scriptContext,bVar1,isSticky,regularExpression,input,local_54,local_54,false,
                     true,false);
  bVar1 = UnifiedRegex::GroupInfo::IsUndefined(&local_54);
  if (bVar1) {
    local_78 = 0xffffffff;
  }
  else {
    local_78 = local_54.offset;
  }
  bVar1 = TaggedInt::IsOverflow(local_78);
  if (bVar1) {
    local_10 = JavascriptNumber::NewInlined((double)(int)local_78,scriptContext);
  }
  else {
    local_10 = TaggedInt::ToVarUnchecked(local_78);
  }
  return local_10;
}

Assistant:

Var RegexHelper::RegexSearchImpl(ScriptContext* scriptContext, JavascriptRegExp* regularExpression, JavascriptString* input)
    {
        UnifiedRegex::RegexPattern* pattern = regularExpression->GetPattern();
        const char16* inputStr = input->GetString();
        CharCount inputLength = input->GetLength();

#if ENABLE_REGEX_CONFIG_OPTIONS
        RegexHelperTrace(scriptContext, UnifiedRegex::RegexStats::Search, regularExpression, input);
#endif
        UnifiedRegex::GroupInfo match = RegexHelper::SimpleMatch(scriptContext, pattern, inputStr, inputLength, 0);

        PropagateLastMatch(scriptContext, pattern->IsGlobal(), pattern->IsSticky(), regularExpression, input, match, match, false, true);

        return JavascriptNumber::ToVar(match.IsUndefined() ? -1 : (int32)match.offset, scriptContext);
    }